

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  undefined8 *puVar1;
  ushort uVar2;
  StkId pTVar3;
  Value *pVVar4;
  undefined8 uVar5;
  Value VVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  CallInfo *pCVar11;
  uint uVar12;
  long lVar13;
  Value *pVVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  TValue *pTVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  
  uVar2 = ci->nresults;
  uVar17 = (uint)(short)uVar2;
  if ((L->hookmask & 6U) == 0) {
    pCVar11 = ci->previous;
    pTVar18 = firstResult;
  }
  else {
    if ((L->hookmask & 2U) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar3) + (long)L->stack);
    }
    pCVar11 = ci->previous;
    L->oldpc = (pCVar11->u).l.savedpc;
    pTVar18 = firstResult;
  }
  pVVar4 = &ci->func->value_;
  L->ci = pCVar11;
  uVar12 = (uint)uVar2;
  iVar10 = 1;
  if (uVar2 != 0) {
    if (uVar12 == 1) {
      if (nres == 0) {
        pTVar18 = &luaO_nilobject_;
      }
      VVar6 = *(Value *)&pTVar18->tt_;
      *pVVar4 = pTVar18->value_;
      pVVar4[1] = VVar6;
      iVar10 = 1;
      uVar12 = 1;
    }
    else if (uVar12 == 0xffff) {
      uVar12 = nres;
      if (nres < 1) {
        iVar10 = 0;
      }
      else {
        iVar10 = 0;
        lVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pTVar18->value_ + lVar13);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)pVVar4 + lVar13) = *puVar1;
          ((undefined8 *)((long)pVVar4 + lVar13))[1] = uVar5;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)(uint)nres << 4 != lVar13);
      }
    }
    else {
      uVar12 = uVar17;
      if (nres < (int)uVar17) {
        if (nres < 1) {
          nres = 0;
        }
        else {
          lVar13 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pTVar18->value_ + lVar13);
            uVar5 = puVar1[1];
            *(undefined8 *)((long)pVVar4 + lVar13) = *puVar1;
            ((undefined8 *)((long)pVVar4 + lVar13))[1] = uVar5;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)(uint)nres << 4 != lVar13);
        }
        auVar9 = _DAT_00163190;
        auVar8 = _DAT_00163180;
        auVar7 = _DAT_00163170;
        if (nres < (int)uVar17) {
          lVar13 = (ulong)uVar17 - (ulong)(uint)nres;
          lVar15 = lVar13 + -1;
          auVar19._8_4_ = (int)lVar15;
          auVar19._0_8_ = lVar15;
          auVar19._12_4_ = (int)((ulong)lVar15 >> 0x20);
          pVVar14 = pVVar4 + (ulong)(uint)nres * 2 + 7;
          uVar16 = 0;
          auVar19 = auVar19 ^ _DAT_00163190;
          do {
            auVar21._8_4_ = (int)uVar16;
            auVar21._0_8_ = uVar16;
            auVar21._12_4_ = (int)(uVar16 >> 0x20);
            auVar22 = (auVar21 | auVar8) ^ auVar9;
            iVar20 = auVar19._4_4_;
            if ((bool)(~(auVar22._4_4_ == iVar20 && auVar19._0_4_ < auVar22._0_4_ ||
                        iVar20 < auVar22._4_4_) & 1)) {
              pVVar14[-6].b = 0;
            }
            if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
                auVar22._12_4_ <= auVar19._12_4_) {
              pVVar14[-4].b = 0;
            }
            auVar21 = (auVar21 | auVar7) ^ auVar9;
            iVar23 = auVar21._4_4_;
            if (iVar23 <= iVar20 && (iVar23 != iVar20 || auVar21._0_4_ <= auVar19._0_4_)) {
              pVVar14[-2].b = 0;
              pVVar14->b = 0;
            }
            uVar16 = uVar16 + 4;
            pVVar14 = pVVar14 + 8;
          } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar16);
        }
      }
      else if (0 < (short)uVar2) {
        lVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pTVar18->value_ + lVar13);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)pVVar4 + lVar13) = *puVar1;
          ((undefined8 *)((long)pVVar4 + lVar13))[1] = uVar5;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)uVar17 << 4 != lVar13);
      }
    }
  }
  L->top = (StkId)(pVVar4 + (long)(int)uVar12 * 2);
  return iVar10;
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}